

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Bdd * __thiscall sylvan::Bdd::operator*=(Bdd *this,Bdd *other)

{
  BDD BVar1;
  BDDVAR in_ECX;
  BDD in_RDX;
  
  BVar1 = sylvan_and_RUN((sylvan *)this->bdd,other->bdd,in_RDX,in_ECX);
  this->bdd = BVar1;
  return this;
}

Assistant:

Bdd&
Bdd::operator*=(const Bdd& other)
{
    bdd = sylvan_and(bdd, other.bdd);
    return *this;
}